

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

bool __thiscall Bstrlib::CBString::operator==(CBString *this,uchar *s)

{
  CBStringException *pCVar1;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  int retval;
  uchar *s_local;
  CBString *this_local;
  
  if (s == (uchar *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"CBString::Failure in compare (== NULL)",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_48);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = biseqcstr(&this->super_tagbstring,(char *)s);
  if (bstr__cppwrapper_exception.msg.field_2._12_4_ == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"CBString::Failure in compare (==)",&local_c9);
    CBStringException::CBStringException((CBStringException *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar1,(CBStringException *)local_a8);
    __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return 0 < (int)bstr__cppwrapper_exception.msg.field_2._12_4_;
}

Assistant:

bool CBString::operator == (const unsigned char * s) const {
	int retval;
	if (NULL == s) {
		bstringThrow ("Failure in compare (== NULL)");
	}
	if (BSTR_ERR == (retval = biseqcstr ((bstring) this, (const char *) s))) {
		bstringThrow ("Failure in compare (==)");
	}
	return retval > 0;
}